

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<long>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<long> *out)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  pair<const_char_*,_bool> pVar5;
  
  uVar3 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  if ((int)uVar3 < size) {
    do {
      RepeatedField<long>::Reserve(out,out->current_size_ + ((int)uVar3 >> 3));
      uVar4 = uVar3 & 0xfffffff8;
      iVar1 = out->current_size_;
      out->current_size_ = ((int)uVar3 >> 3) + iVar1;
      memcpy((void *)((long)iVar1 * 8 + (long)out->arena_or_elements_),ptr,(long)(int)uVar4);
      ptr = ptr + (int)uVar4;
      pcVar2 = this->buffer_end_;
      if (this->limit_end_ <= ptr) {
        if ((long)ptr - (long)pcVar2 == (long)this->limit_) {
          return (char *)0x0;
        }
        pVar5 = DoneFallback(this,ptr,-1);
        ptr = pVar5.first;
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          return (char *)0x0;
        }
        pcVar2 = this->buffer_end_;
      }
      uVar3 = ((int)pcVar2 - (int)ptr) + 0x10;
      size = size - uVar4;
    } while ((int)uVar3 < size);
  }
  RepeatedField<long>::Reserve(out,out->current_size_ + (size >> 3));
  uVar3 = size & 0xfffffff8;
  iVar1 = out->current_size_;
  out->current_size_ = (size >> 3) + iVar1;
  memcpy((void *)((long)iVar1 * 8 + (long)out->arena_or_elements_),ptr,(long)(int)uVar3);
  pcVar2 = (char *)0x0;
  if (size == uVar3) {
    pcVar2 = ptr + (int)uVar3;
  }
  return pcVar2;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    ptr += block_size;
    size -= block_size;
    if (DoneWithCheck(&ptr, -1)) return nullptr;
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}